

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ImageChannelValues * __thiscall
pbrt::Image::GetChannels(Image *this,Point2i p,ImageChannelDesc *desc,WrapMode2D wrapMode)

{
  int iVar1;
  Point2i p_00;
  span<float> vout;
  span<const_unsigned_char> vin;
  WrapMode2D wrapMode_00;
  Point2i resolution;
  bool bVar2;
  const_reference ptr;
  const_reference this_00;
  ulong uVar3;
  size_t sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *in_RCX;
  undefined8 in_RDX;
  int *in_RSI;
  ImageChannelValues *in_RDI;
  undefined8 in_R8;
  float fVar8;
  int i_2;
  int i_1;
  int i;
  size_t pixelOffset;
  ImageChannelValues *cv;
  Image *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe80;
  value_type in_stack_fffffffffffffe84;
  ColorEncodingHandle *in_stack_fffffffffffffe90;
  float *in_stack_fffffffffffffe98;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_01;
  ImageChannelValues *in_stack_fffffffffffffea0;
  uchar *in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffeb0;
  Point2i *in_stack_fffffffffffffed8;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this_02;
  undefined4 local_120;
  WrapMode in_stack_fffffffffffffee4;
  undefined4 uVar9;
  WrapMode in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int iVar10;
  int iStack_10c;
  char *in_stack_ffffffffffffff18;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this_03;
  undefined8 in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  LogLevel level;
  int local_90;
  int local_8c;
  span<float> local_88;
  span<const_unsigned_char> local_78;
  int local_64;
  undefined8 local_60;
  size_t local_58;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 local_29;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  level = (LogLevel)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  iVar10 = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  local_29 = 0;
  local_28 = in_RCX;
  local_18 = in_R8;
  local_10 = in_RDX;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::size(in_RCX);
  ImageChannelValues::ImageChannelValues
            (in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98,
             (Float)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  local_38 = *(undefined8 *)(in_RSI + 1);
  local_40 = local_18;
  resolution.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffffef0;
  resolution.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffeec;
  wrapMode_00.wrap.values[1] = in_stack_fffffffffffffee8;
  wrapMode_00.wrap.values[0] = in_stack_fffffffffffffee4;
  bVar2 = RemapPixelCoords(in_stack_fffffffffffffed8,resolution,wrapMode_00);
  if (bVar2) {
    local_60 = local_10;
    p_00.super_Tuple2<pbrt::Point2,_int>.y = (int)in_stack_fffffffffffffe84;
    p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_fffffffffffffe80;
    local_58 = PixelOffset(in_stack_fffffffffffffe78,p_00);
    iVar1 = *in_RSI;
    if (iVar1 == 0) {
      local_64 = 0;
      while( true ) {
        uVar3 = (ulong)local_64;
        sVar4 = InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::size(local_28);
        if (sVar4 <= uVar3) break;
        this_03 = (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                  (in_RSI + 0x2e);
        sVar4 = local_58;
        pvVar5 = InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::operator[]
                           ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (size_type)in_stack_fffffffffffffe78);
        ptr = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
              operator[](this_03,sVar4 + (long)*pvVar5);
        pstd::span<const_unsigned_char>::span(&local_78,ptr,1);
        pvVar7 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (size_type)in_stack_fffffffffffffe78);
        pstd::span<float>::span(&local_88,pvVar7,1);
        vin.n = in_stack_fffffffffffffeb0;
        vin.ptr = in_stack_fffffffffffffea8;
        vout.n = (size_t)in_stack_fffffffffffffea0;
        vout.ptr = in_stack_fffffffffffffe98;
        ColorEncodingHandle::ToLinear(in_stack_fffffffffffffe90,vin,vout);
        local_64 = local_64 + 1;
      }
    }
    else if (iVar1 == 1) {
      local_8c = 0;
      while( true ) {
        iStack_10c = local_8c >> 0x1f;
        iVar10 = local_8c;
        sVar4 = InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::size(local_28);
        if (sVar4 <= CONCAT44(iStack_10c,iVar10)) break;
        this_02 = (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)
                  (in_RSI + 0x36);
        local_120 = (undefined4)local_58;
        uVar9 = (undefined4)(local_58 >> 0x20);
        pvVar5 = InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::operator[]
                           ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (size_type)in_stack_fffffffffffffe78);
        this_00 = pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::
                  operator[](this_02,CONCAT44(uVar9,local_120) + (long)*pvVar5);
        fVar8 = Half::operator_cast_to_float(this_00);
        pvVar7 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (size_type)in_stack_fffffffffffffe78);
        *pvVar7 = fVar8;
        local_8c = local_8c + 1;
      }
    }
    else {
      if (iVar1 != 2) {
        LogFatal(level,in_stack_ffffffffffffff28,iVar10,in_stack_ffffffffffffff18);
      }
      local_90 = 0;
      while( true ) {
        uVar3 = (ulong)local_90;
        sVar4 = InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::size(local_28);
        if (sVar4 <= uVar3) break;
        this_01 = (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RSI + 0x3e);
        sVar4 = local_58;
        pvVar5 = InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::operator[]
                           ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (size_type)in_stack_fffffffffffffe78);
        pvVar6 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           (this_01,sVar4 + (long)*pvVar5);
        in_stack_fffffffffffffe84 = *pvVar6;
        pvVar7 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            (size_type)in_stack_fffffffffffffe78);
        *pvVar7 = in_stack_fffffffffffffe84;
        local_90 = local_90 + 1;
      }
    }
  }
  return in_RDI;
}

Assistant:

ImageChannelValues Image::GetChannels(Point2i p, const ImageChannelDesc &desc,
                                      WrapMode2D wrapMode) const {
    ImageChannelValues cv(desc.offset.size(), Float(0));
    if (!RemapPixelCoords(&p, resolution, wrapMode))
        return cv;

    size_t pixelOffset = PixelOffset(p);
    switch (format) {
    case PixelFormat::U256: {
        for (int i = 0; i < desc.offset.size(); ++i)
            encoding.ToLinear({&p8[pixelOffset + desc.offset[i]], 1}, {&cv[i], 1});
        break;
    }
    case PixelFormat::Half: {
        for (int i = 0; i < desc.offset.size(); ++i)
            cv[i] = Float(p16[pixelOffset + desc.offset[i]]);
        break;
    }
    case PixelFormat::Float: {
        for (int i = 0; i < desc.offset.size(); ++i)
            cv[i] = p32[pixelOffset + desc.offset[i]];
        break;
    }
    default:
        LOG_FATAL("Unhandled PixelFormat");
    }

    return cv;
}